

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O0

path * __thiscall
vfs::path::combine<std::__cxx11::string>
          (path *__return_storage_ptr__,path *this,path *p0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *paths)

{
  path local_60;
  path local_40;
  path *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *paths_local;
  path *p0_local;
  
  local_20 = p0;
  paths_local = &this->pathStr_;
  p0_local = __return_storage_ptr__;
  path(&local_60,&p0->pathStr_);
  combine(&local_40,&local_60);
  combine_internal(__return_storage_ptr__,this,&local_40);
  ~path(&local_40);
  ~path(&local_60);
  return __return_storage_ptr__;
}

Assistant:

static path combine(const path &p0, _Paths &&...paths)
        {
            return combine_internal(p0, combine(std::forward<_Paths>(paths)...));
        }